

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_containers.h
# Opt level: O0

ThreadData * __thiscall
density_tests::
aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>_>::ThreadData>
::allocate(aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>_>::ThreadData>
           *this,size_t i_count)

{
  ThreadData *pTVar1;
  size_t i_count_local;
  aligned_allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>_>::ThreadData>
  *this_local;
  
  pTVar1 = (ThreadData *)density::aligned_allocate(i_count * 0x1440,0x40,0);
  return pTVar1;
}

Assistant:

TYPE * allocate(std::size_t i_count)
        {
            return static_cast<TYPE *>(
              density::aligned_allocate(i_count * sizeof(TYPE), alignof(TYPE)));
        }